

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O0

Expression * __thiscall
Kandinsky::BaseExpression::differentiate(BaseExpression *this,Variable *variable)

{
  long *in_RSI;
  Expression *in_RDI;
  Expression *this_00;
  undefined1 local_38 [16];
  undefined1 local_28 [40];
  
  this_00 = in_RDI;
  Variable::getVariableExpressionPtr((Variable *)in_RDI);
  (**(code **)(*in_RSI + 8))(local_28,in_RSI,local_38);
  Expression::Expression<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (this_00,(shared_ptr<Kandinsky::BaseExpression> *)in_RDI);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x124a01);
  std::shared_ptr<Kandinsky::VariableExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::VariableExpression> *)0x124a0b);
  return this_00;
}

Assistant:

Expression BaseExpression::differentiate(const Variable& variable) const
    {
        return Expression(derivative(variable.getVariableExpressionPtr()));
    }